

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_address-inl.h
# Opt level: O1

bool anon_unknown.dwarf_49e8::CheckAddressPipes(uintptr_t addr,int pagesize)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  undefined8 uVar4;
  char *pcVar5;
  long lVar6;
  int unaff_R15D;
  bool bVar7;
  SpinLockHolder local_128;
  char drainbuf [256];
  
  if (CheckAddressPipes::once.done_flag_ != 1) {
    local_128.lock_ = (SpinLock *)&CheckAddressPipes::once.lock_storage_;
    LOCK();
    bVar7 = CheckAddressPipes::once.lock_storage_.bytes_ == (uint8_t  [4])0x0;
    if (bVar7) {
      CheckAddressPipes::once.lock_storage_.bytes_[0] = '\x01';
      CheckAddressPipes::once.lock_storage_.bytes_[1] = '\0';
      CheckAddressPipes::once.lock_storage_.bytes_[2] = '\0';
      CheckAddressPipes::once.lock_storage_.bytes_[3] = '\0';
    }
    UNLOCK();
    if (!bVar7) {
      SpinLock::SlowLock((SpinLock *)&CheckAddressPipes::once.lock_storage_);
    }
    if (CheckAddressPipes::once.done_flag_ != 1) {
      iVar1 = pipe(CheckAddressPipes::fds);
      if (iVar1 != 0) {
        pcVar5 = "Check failed: pipe(fds) == 0: pipe(fds)\n";
        uVar4 = 0x28;
LAB_0010939d:
        syscall(1,2,pcVar5,uVar4);
        abort();
      }
      lVar6 = 0;
      do {
        iVar1 = *(int *)((long)CheckAddressPipes::fds + lVar6);
        uVar2 = fcntl(iVar1,1,0);
        if ((int)uVar2 < 0) {
LAB_001093d4:
          pcVar5 = "Check failed: flags >= 0: fcntl get\n";
          uVar4 = 0x24;
          goto LAB_0010939d;
        }
        iVar1 = fcntl(iVar1,2,(ulong)(uVar2 | 1));
        if (iVar1 != 0) {
LAB_001093c1:
          pcVar5 = "Check failed: fcntl(fd, set, flags) == 0: fcntl set\n";
          uVar4 = 0x34;
          goto LAB_0010939d;
        }
        unaff_R15D = *(int *)((long)CheckAddressPipes::fds + lVar6);
        uVar2 = fcntl(unaff_R15D,3,0);
        if ((int)uVar2 < 0) goto LAB_001093d4;
        iVar1 = fcntl(unaff_R15D,4,(ulong)(uVar2 | 0x800));
        if (iVar1 != 0) goto LAB_001093c1;
        lVar6 = lVar6 + 4;
      } while (lVar6 == 4);
      CheckAddressPipes::once.done_flag_ = 1;
    }
    SpinLockHolder::~SpinLockHolder(&local_128);
  }
  do {
    lVar6 = syscall(1,(ulong)(uint)CheckAddressPipes::fds[1],addr,1);
    if ((int)lVar6 == 0) {
      pcVar5 = "Check failed: rv != 0: raw_write(...) == 0\n";
      uVar4 = 0x2b;
      goto LAB_0010939d;
    }
    if ((int)lVar6 < 1) {
      piVar3 = __errno_location();
      if (*piVar3 != 0xb) {
        if (*piVar3 == 0xe) {
          unaff_R15D = 0;
          goto LAB_00109340;
        }
        pcVar5 = "Check failed: errno == EAGAIN: write errno must be EAGAIN\n";
        uVar4 = 0x3a;
        goto LAB_0010939d;
      }
      do {
        do {
          lVar6 = syscall(0,(ulong)(uint)CheckAddressPipes::fds[0],&local_128,0x100);
        } while (-1 < (int)lVar6);
      } while (*piVar3 == 4);
      if (*piVar3 != 0xb) {
        pcVar5 = "Check failed: errno == EAGAIN: read errno must be EAGAIN\n";
        uVar4 = 0x39;
        goto LAB_0010939d;
      }
      bVar7 = true;
    }
    else {
      unaff_R15D = 1;
LAB_00109340:
      bVar7 = false;
    }
    if (!bVar7) {
      return (bool)((byte)unaff_R15D & 1);
    }
  } while( true );
}

Assistant:

bool CheckAddress(uintptr_t addr, int pagesize) {
  static tcmalloc::TrivialOnce once;
  static int fds[2];

  once.RunOnce([] () {
    RAW_CHECK(pipe(fds) == 0, "pipe(fds)");

    auto add_flag = [] (int fd, int get, int set, int the_flag) {
      int flags = fcntl(fd, get, 0);
      RAW_CHECK(flags >= 0, "fcntl get");
      flags |= the_flag;
      RAW_CHECK(fcntl(fd, set, flags) == 0, "fcntl set");
    };

    for (int i = 0; i < 2; i++) {
      add_flag(fds[i], F_GETFD, F_SETFD, FD_CLOEXEC);
      add_flag(fds[i], F_GETFL, F_SETFL, O_NONBLOCK);
    }
  });

  do {
    int rv = raw_write(fds[1], reinterpret_cast<void*>(addr), 1);
    RAW_CHECK(rv != 0, "raw_write(...) == 0");
    if (rv > 0) {
      return true;
    }
    if (errno == EFAULT) {
      return false;
    }

    RAW_CHECK(errno == EAGAIN, "write errno must be EAGAIN");

    char drainbuf[256];
    do {
      rv = raw_read(fds[0], drainbuf, sizeof(drainbuf));
      if (rv < 0 && errno != EINTR) {
        RAW_CHECK(errno == EAGAIN, "read errno must be EAGAIN");
        break;
      }
      // read succeeded or we got EINTR
    } while (true);
  } while (true);

  return false;
}